

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void printDualSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  long *plVar1;
  uint *puVar2;
  byte bVar3;
  Verbosity VVar4;
  uint uVar5;
  Verbosity VVar6;
  Tolerances *pTVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ostream *poVar9;
  ostream **ppoVar10;
  long lVar11;
  Real RVar12;
  double dVar13;
  char cVar14;
  pointer pnVar15;
  NameSet *pNVar16;
  undefined8 uVar17;
  bool bVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  size_t sVar22;
  SPxOut *pSVar23;
  Verbosity old_verbosity;
  long lVar24;
  undefined7 in_register_00000081;
  char *pcVar25;
  long lVar26;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dual;
  Verbosity old_verbosity_8;
  VectorRational dual_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  redcost;
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_3c0;
  limb_type local_3a8;
  undefined8 uStack_3a0;
  long local_398;
  long local_390;
  data_type local_388;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined5 local_358;
  char cStack_353;
  char cStack_352;
  undefined6 uStack_351;
  undefined3 uStack_34b;
  undefined5 uStack_348;
  undefined8 local_340;
  NameSet *local_330;
  undefined1 local_328 [16];
  pointer local_318;
  uint auStack_310 [2];
  uint local_308 [2];
  uint auStack_300 [2];
  uint local_2f8 [2];
  uint auStack_2f0 [2];
  uint local_2e8;
  bool local_2e4;
  limb_type local_2e0;
  long local_2d8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_2d0;
  NameSet *local_2b8;
  SPxOut *local_2b0;
  data_type local_2a8;
  char local_293;
  char local_292;
  uint local_288;
  void *local_280;
  char local_273;
  char local_272;
  data_type local_268;
  char local_253;
  char local_252;
  uint local_248;
  void *local_240;
  char local_233;
  char local_232;
  data_type local_228;
  char local_213;
  char local_212;
  uint local_208;
  void *local_200;
  char local_1f3;
  char local_1f2;
  pointer local_1e8;
  pointer pnStack_1e0;
  pointer local_1d8;
  uint auStack_1d0 [2];
  uint local_1c8 [2];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  pointer local_1a8;
  pointer pnStack_1a0;
  pointer local_198;
  uint auStack_190 [2];
  uint local_188 [2];
  uint auStack_180 [2];
  uint local_178 [2];
  uint auStack_170 [2];
  pointer local_168;
  pointer pnStack_160;
  pointer local_158;
  uint auStack_150 [2];
  uint local_148 [2];
  uint auStack_140 [2];
  uint local_138 [2];
  uint auStack_130 [2];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_2d8 = CONCAT44(local_2d8._4_4_,(int)CONCAT71(in_register_00000081,rational));
  pTVar7 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var8 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
  }
  local_330 = rownames;
  RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
  dVar13 = log10(RVar12);
  iVar19 = (int)-dVar13;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  iVar20 = iVar19 + 10;
  local_2b8 = colnames;
  if (real) {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&local_3c0,
                 (soplex->_realLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar18 = ::soplex::
             SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::getDualFarkas(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)&local_3c0);
    if (bVar18) {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual ray (name, value):\n",0x19);
        (soplex->spxout).m_verbosity = VVar4;
      }
      if (0 < (soplex->_realLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_390 = (long)iVar20;
        local_398 = (long)iVar19;
        lVar26 = 9;
        lVar24 = 0;
        do {
          plVar1 = (long *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x48);
          local_168 = (pointer)*plVar1;
          pnStack_160 = (pointer)plVar1[1];
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x38);
          local_158 = *(pointer *)puVar2;
          auStack_150 = *(uint (*) [2])(puVar2 + 2);
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x28);
          local_148 = *(uint (*) [2])puVar2;
          auStack_140 = *(uint (*) [2])(puVar2 + 2);
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x18);
          local_138 = *(uint (*) [2])puVar2;
          auStack_130 = *(uint (*) [2])(puVar2 + 2);
          uVar5 = *(uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -8);
          bVar3 = *(byte *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -4);
          local_3a8 = ((local_3c0.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend
                      .
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.la[lVar26];
          uStack_3a0 = 0;
          pTVar7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var8 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            }
          }
          RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
          local_2f8[0] = local_138[0];
          local_2f8[1] = local_138[1];
          auStack_2f0[0] = auStack_130[0];
          auStack_2f0[1] = auStack_130[1];
          local_308[0] = local_148[0];
          local_308[1] = local_148[1];
          auStack_300[0] = auStack_140[0];
          auStack_300[1] = auStack_140[1];
          local_318 = local_158;
          auStack_310[0] = auStack_150[0];
          auStack_310[1] = auStack_150[1];
          local_328._0_8_ = local_168;
          uVar17 = local_328._0_8_;
          local_328._8_8_ = pnStack_160;
          local_2e0 = local_3a8;
          local_2e4 = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_328._0_4_ = SUB84(local_168,0),
             local_328._0_4_ != 0 || (Verbosity)local_3a8 != 0)) {
            local_2e4 = (bool)(bVar3 ^ 1);
          }
          bVar18 = false;
          local_328._0_8_ = uVar17;
          local_2e8 = uVar5;
          if (((Verbosity)local_3a8 != 2) && (!NAN(RVar12))) {
            local_340 = 0x1000000000;
            local_388.double_first = 0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = 0;
            cStack_353 = '\0';
            cStack_352 = '\0';
            uStack_351 = 0;
            uStack_34b = 0;
            uStack_348 = 0;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_388.ld,RVar12);
            iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_328,
                                (cpp_dec_float<100U,_int,_void> *)&local_388.ld);
            bVar18 = 0 < iVar21;
          }
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          if ((bVar18) && (VVar4 = (soplex->spxout).m_verbosity, 2 < (int)VVar4)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar9 = (soplex->spxout).m_streams[3];
            if (local_330->mem == (char *)0x0) {
              std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              pcVar25 = local_330->mem +
                        (local_330->set).theitem[(local_330->set).thekey[lVar24].idx].data;
              sVar22 = strlen(pcVar25);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            VVar6 = (soplex->spxout).m_verbosity;
            ppoVar10 = (soplex->spxout).m_streams;
            poVar9 = ppoVar10[VVar6];
            lVar11 = *(long *)poVar9;
            *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 0x10) = local_390;
            *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = local_398;
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x48);
            local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x38);
            local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x28);
            local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
            local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x18);
            local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
            local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
            local_88.m_backend.exp =
                 *(int *)((long)local_3c0.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -8);
            local_88.m_backend.neg =
                 *(bool *)((long)local_3c0.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -4);
            local_88.m_backend._72_8_ =
                 ((local_3c0.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data.la[lVar26];
            boost::multiprecision::operator<<(ppoVar10[VVar6],&local_88);
            poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar14 = (char)poVar9;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
            std::ostream::put(cVar14);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar4;
          }
          lVar24 = lVar24 + 1;
          lVar26 = lVar26 + 10;
        } while (lVar24 < (soplex->_realLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero (within ",0x23);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar24 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 1;
        lVar24 = *(long *)(lVar24 + -0x18);
        *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 0x100;
        pTVar7 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var8 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          }
        }
        RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
        std::ostream::_M_insert<double>(RVar12);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar24 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 8;
        lVar24 = *(long *)(lVar24 + -0x18);
        *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,").",2);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar14 = (char)poVar9;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
        std::ostream::put(cVar14);
        std::ostream::flush();
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
        }
        (soplex->spxout).m_verbosity = VVar4;
      }
    }
    else if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xe0 & 4) != 0)) ||
             ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 4) != 0))))
            && (bVar18 = ::soplex::
                         SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::getDual(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)&local_3c0), bVar18)) {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual solution (name, value):\n",0x1e);
        (soplex->spxout).m_verbosity = VVar4;
      }
      if (0 < (soplex->_realLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_390 = (long)iVar20;
        local_398 = (long)iVar19;
        lVar24 = 9;
        lVar26 = 0;
        do {
          plVar1 = (long *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x48);
          local_1a8 = (pointer)*plVar1;
          pnStack_1a0 = (pointer)plVar1[1];
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x38);
          local_198 = *(pointer *)puVar2;
          auStack_190 = *(uint (*) [2])(puVar2 + 2);
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x28);
          local_188 = *(uint (*) [2])puVar2;
          auStack_180 = *(uint (*) [2])(puVar2 + 2);
          puVar2 = (uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x18);
          local_178 = *(uint (*) [2])puVar2;
          auStack_170 = *(uint (*) [2])(puVar2 + 2);
          uVar5 = *(uint *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -8);
          bVar3 = *(byte *)((long)local_3c0.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -4);
          local_3a8 = ((local_3c0.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend
                      .
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.la[lVar24];
          uStack_3a0 = 0;
          pTVar7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var8 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            }
          }
          RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
          local_2f8[0] = local_178[0];
          local_2f8[1] = local_178[1];
          auStack_2f0[0] = auStack_170[0];
          auStack_2f0[1] = auStack_170[1];
          local_308[0] = local_188[0];
          local_308[1] = local_188[1];
          auStack_300[0] = auStack_180[0];
          auStack_300[1] = auStack_180[1];
          local_318 = local_198;
          auStack_310[0] = auStack_190[0];
          auStack_310[1] = auStack_190[1];
          local_328._0_8_ = local_1a8;
          uVar17 = local_328._0_8_;
          local_328._8_8_ = pnStack_1a0;
          local_2e0 = local_3a8;
          local_2e4 = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_328._0_4_ = SUB84(local_1a8,0),
             local_328._0_4_ != 0 || (Verbosity)local_3a8 != 0)) {
            local_2e4 = (bool)(bVar3 ^ 1);
          }
          bVar18 = false;
          local_328._0_8_ = uVar17;
          local_2e8 = uVar5;
          if (((Verbosity)local_3a8 != 2) && (!NAN(RVar12))) {
            local_340 = 0x1000000000;
            local_388.double_first = 0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = 0;
            cStack_353 = '\0';
            cStack_352 = '\0';
            uStack_351 = 0;
            uStack_34b = 0;
            uStack_348 = 0;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_388.ld,RVar12);
            iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_328,
                                (cpp_dec_float<100U,_int,_void> *)&local_388.ld);
            bVar18 = 0 < iVar21;
          }
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          if ((bVar18) && (VVar4 = (soplex->spxout).m_verbosity, 2 < (int)VVar4)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar9 = (soplex->spxout).m_streams[3];
            if (local_330->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
            }
            else {
              pcVar25 = local_330->mem +
                        (local_330->set).theitem[(local_330->set).thekey[lVar26].idx].data;
              sVar22 = strlen(pcVar25);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            VVar6 = (soplex->spxout).m_verbosity;
            ppoVar10 = (soplex->spxout).m_streams;
            poVar9 = ppoVar10[VVar6];
            lVar11 = *(long *)poVar9;
            *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 0x10) = local_390;
            *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = local_398;
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x48);
            local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x38);
            local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x28);
            local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
            local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_3c0.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x18);
            local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
            local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
            local_d8.m_backend.exp =
                 *(int *)((long)local_3c0.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -8);
            local_d8.m_backend.neg =
                 *(bool *)((long)local_3c0.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -4);
            local_d8.m_backend._72_8_ =
                 ((local_3c0.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data.la[lVar24];
            boost::multiprecision::operator<<(ppoVar10[VVar6],&local_d8);
            poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar14 = (char)poVar9;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
            std::ostream::put(cVar14);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar4;
          }
          lVar26 = lVar26 + 1;
          lVar24 = lVar24 + 10;
        } while (lVar26 < (soplex->_realLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other dual values are zero (within ",0x27);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar24 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 1;
        lVar24 = *(long *)(lVar24 + -0x18);
        *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 0x100;
        pTVar7 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var8 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          }
        }
        RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
        std::ostream::_M_insert<double>(RVar12);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar24 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 8;
        lVar24 = *(long *)(lVar24 + -0x18);
        *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,").",2);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar14 = (char)poVar9;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
        std::ostream::put(cVar14);
        std::ostream::flush();
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
        }
        (soplex->spxout).m_verbosity = VVar4;
      }
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::VectorBase(&local_2d0,
                   (soplex->_realLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
      bVar18 = ::soplex::
               SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::getRedCost(soplex,&local_2d0);
      if (bVar18) {
        pSVar23 = &soplex->spxout;
        VVar4 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar4) {
          (soplex->spxout).m_verbosity = INFO1;
          ::soplex::operator<<(pSVar23,"\nReduced costs (name, value):\n");
          (soplex->spxout).m_verbosity = VVar4;
        }
        local_2b0 = pSVar23;
        if (0 < (soplex->_realLP->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          local_390 = (long)iVar20;
          local_398 = (long)iVar19;
          lVar24 = 9;
          lVar26 = 0;
          do {
            puVar2 = ((local_2d0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar24 * 2 + -0x12;
            local_1e8 = *(pointer *)puVar2;
            pnStack_1e0 = *(pointer *)(puVar2 + 2);
            puVar2 = ((local_2d0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar24 * 2 + -0xe;
            local_1d8 = *(pointer *)puVar2;
            auStack_1d0 = *(uint (*) [2])(puVar2 + 2);
            puVar2 = ((local_2d0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar24 * 2 + -10;
            local_1c8 = *(uint (*) [2])puVar2;
            auStack_1c0 = *(uint (*) [2])(puVar2 + 2);
            puVar2 = ((local_2d0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar24 * 2 + -6;
            local_1b8 = *(uint (*) [2])puVar2;
            auStack_1b0 = *(uint (*) [2])(puVar2 + 2);
            uVar5 = ((local_2d0.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                    [lVar24 * 2 + -2];
            bVar3 = (byte)((local_2d0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                          [lVar24 * 2 + -1];
            local_3a8 = *(limb_type *)
                         (((local_2d0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                         lVar24 * 2);
            uStack_3a0 = 0;
            pTVar7 = (soplex->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var8 = (soplex->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              }
            }
            RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
            local_2f8[0] = local_1b8[0];
            local_2f8[1] = local_1b8[1];
            auStack_2f0[0] = auStack_1b0[0];
            auStack_2f0[1] = auStack_1b0[1];
            local_308[0] = local_1c8[0];
            local_308[1] = local_1c8[1];
            auStack_300[0] = auStack_1c0[0];
            auStack_300[1] = auStack_1c0[1];
            local_318 = local_1d8;
            auStack_310[0] = auStack_1d0[0];
            auStack_310[1] = auStack_1d0[1];
            local_328._0_8_ = local_1e8;
            uVar17 = local_328._0_8_;
            local_328._8_8_ = pnStack_1e0;
            local_2e0 = local_3a8;
            local_2e4 = (bool)bVar3;
            if ((bVar3 != 0) &&
               (local_328._0_4_ = SUB84(local_1e8,0),
               local_328._0_4_ != 0 || (Verbosity)local_3a8 != 0)) {
              local_2e4 = (bool)(bVar3 ^ 1);
            }
            bVar18 = false;
            local_328._0_8_ = uVar17;
            local_2e8 = uVar5;
            if (((Verbosity)local_3a8 != 2) && (!NAN(RVar12))) {
              local_340 = 0x1000000000;
              local_388.double_first = 0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = 0;
              cStack_353 = '\0';
              cStack_352 = '\0';
              uStack_351 = 0;
              uStack_34b = 0;
              uStack_348 = 0;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)&local_388.ld,RVar12);
              iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_328,
                                  (cpp_dec_float<100U,_int,_void> *)&local_388.ld);
              bVar18 = 0 < iVar21;
            }
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
            }
            if ((bVar18) && (VVar4 = (soplex->spxout).m_verbosity, 2 < (int)VVar4)) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar9 = (soplex->spxout).m_streams[3];
              if (local_2b8->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
              }
              else {
                pcVar25 = local_2b8->mem +
                          (local_2b8->set).theitem[(local_2b8->set).thekey[lVar26].idx].data;
                sVar22 = strlen(pcVar25);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              VVar6 = (soplex->spxout).m_verbosity;
              ppoVar10 = (soplex->spxout).m_streams;
              poVar9 = ppoVar10[VVar6];
              lVar11 = *(long *)poVar9;
              *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 0x10) = local_390;
              *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = local_398;
              puVar2 = ((local_2d0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar24 * 2 + -0x12;
              local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = ((local_2d0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar24 * 2 + -0xe;
              local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = ((local_2d0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar24 * 2 + -10;
              local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
              local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = ((local_2d0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar24 * 2 + -6;
              local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
              local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
              local_128.m_backend.exp =
                   ((local_2d0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                   [lVar24 * 2 + -2];
              local_128.m_backend.neg =
                   SUB41(((local_2d0.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                         [lVar24 * 2 + -1],0);
              puVar2 = ((local_2d0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar24 * 2;
              local_128.m_backend.fpclass = puVar2[0];
              local_128.m_backend.prec_elem = puVar2[1];
              boost::multiprecision::operator<<(ppoVar10[VVar6],&local_128);
              poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar14 = (char)poVar9;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
              std::ostream::put(cVar14);
              std::ostream::flush();
              (soplex->spxout).m_verbosity = VVar4;
            }
            lVar26 = lVar26 + 1;
            lVar24 = lVar24 + 10;
          } while (lVar26 < (soplex->_realLP->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        VVar4 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar4) {
          (soplex->spxout).m_verbosity = INFO1;
          pSVar23 = ::soplex::operator<<(local_2b0,"All other reduced costs are zero (within ");
          poVar9 = pSVar23->m_streams[pSVar23->m_verbosity];
          lVar24 = *(long *)poVar9;
          *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 1;
          lVar24 = *(long *)(lVar24 + -0x18);
          *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 0x100
          ;
          pTVar7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var8 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            }
          }
          RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
          std::ostream::_M_insert<double>(RVar12);
          poVar9 = pSVar23->m_streams[pSVar23->m_verbosity];
          lVar24 = *(long *)poVar9;
          *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 8;
          lVar24 = *(long *)(lVar24 + -0x18);
          *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 4;
          pSVar23 = ::soplex::operator<<(pSVar23,").");
          std::endl<char,std::char_traits<char>>(pSVar23->m_streams[pSVar23->m_verbosity]);
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          (soplex->spxout).m_verbosity = VVar4;
        }
      }
      if (local_2d0.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2d0.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No dual information available.\n",0x1f);
        (soplex->spxout).m_verbosity = VVar4;
      }
    }
    if (local_3c0.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3c0.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3c0.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3c0.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((char)local_2d8 != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)local_328,
                 (soplex->_realLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar18 = ::soplex::
             SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::getDualFarkasRational
                       (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)local_328);
    if (bVar18) {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual ray (name, value):\n",0x19);
        (soplex->spxout).m_verbosity = VVar4;
      }
      pNVar16 = local_330;
      if (0 < (soplex->_realLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_2d8 = (long)iVar20;
        lVar24 = 0;
        lVar26 = 0;
        do {
          uVar17 = local_328._0_8_;
          local_3c0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_388.ld,(longlong *)&local_3c0,(type *)0x0);
          iVar20 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                           *)uVar17)->m_value).num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar24),
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_388.ld);
          if ((cStack_353 == '\0') && (cStack_352 == '\0')) {
            operator_delete((void *)local_368._8_8_,(ulong)(uint)local_368._0_4_ << 3);
          }
          if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
            operator_delete(local_388.ld.data,(ulong)local_388.ld.capacity << 3);
          }
          if (iVar20 != 0) {
            VVar4 = (soplex->spxout).m_verbosity;
            local_3a8 = CONCAT44(local_3a8._4_4_,VVar4);
            if (2 < (int)VVar4) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar9 = (soplex->spxout).m_streams[3];
              if (pNVar16->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
              }
              else {
                pcVar25 = pNVar16->mem +
                          (pNVar16->set).theitem[(pNVar16->set).thekey[lVar26].idx].data;
                sVar22 = strlen(pcVar25);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              lVar11 = *(long *)poVar9;
              *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 0x10) = local_2d8;
              *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = (long)iVar19;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_228.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                               *)local_328._0_8_)->m_value).num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar24));
              boost::multiprecision::operator<<
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_228.ld);
              poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar14 = (char)poVar9;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
              std::ostream::put(cVar14);
              std::ostream::flush();
              if ((local_1f3 == '\0') && (local_1f2 == '\0')) {
                operator_delete(local_200,(ulong)local_208 << 3);
              }
              if ((local_213 == '\0') && (local_212 == '\0')) {
                operator_delete(local_228.ld.data,(ulong)local_228.ld.capacity << 3);
              }
              (soplex->spxout).m_verbosity = (Verbosity)local_3a8;
            }
          }
          lVar26 = lVar26 + 1;
          lVar24 = lVar24 + 0x40;
        } while (lVar26 < (soplex->_realLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero.",0x1b);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar14 = (char)poVar9;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
        std::ostream::put(cVar14);
        std::ostream::flush();
        (soplex->spxout).m_verbosity = VVar4;
      }
    }
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xe0 & 4) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 4) != 0)))) &&
       (bVar18 = ::soplex::
                 SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::getDualRational(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                           *)local_328), bVar18)) {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual solution (name, value):\n",0x1e);
        (soplex->spxout).m_verbosity = VVar4;
      }
      pNVar16 = local_330;
      if (0 < (soplex->_rationalLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .set.thenum) {
        lVar24 = 0;
        lVar26 = 0;
        do {
          uVar17 = local_328._0_8_;
          local_3c0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_388.ld,(longlong *)&local_3c0,(type *)0x0);
          iVar19 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                           *)uVar17)->m_value).num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar24),
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_388.ld);
          if ((cStack_353 == '\0') && (cStack_352 == '\0')) {
            operator_delete((void *)local_368._8_8_,(ulong)(uint)local_368._0_4_ << 3);
          }
          if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
            operator_delete(local_388.ld.data,(ulong)local_388.ld.capacity << 3);
          }
          if (iVar19 != 0) {
            VVar4 = (soplex->spxout).m_verbosity;
            local_3a8 = CONCAT44(local_3a8._4_4_,VVar4);
            if (2 < (int)VVar4) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar9 = (soplex->spxout).m_streams[3];
              if (pNVar16->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
              }
              else {
                pcVar25 = pNVar16->mem +
                          (pNVar16->set).theitem[(pNVar16->set).thekey[lVar26].idx].data;
                sVar22 = strlen(pcVar25);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_268.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                               *)local_328._0_8_)->m_value).num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar24));
              boost::multiprecision::operator<<
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_268.ld);
              poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar14 = (char)poVar9;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
              std::ostream::put(cVar14);
              std::ostream::flush();
              if ((local_233 == '\0') && (local_232 == '\0')) {
                operator_delete(local_240,(ulong)local_248 << 3);
              }
              if ((local_253 == '\0') && (local_252 == '\0')) {
                operator_delete(local_268.ld.data,(ulong)local_268.ld.capacity << 3);
              }
              (soplex->spxout).m_verbosity = (Verbosity)local_3a8;
            }
          }
          lVar26 = lVar26 + 1;
          lVar24 = lVar24 + 0x40;
        } while (lVar26 < (soplex->_rationalLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          .set.thenum);
      }
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other dual values are zero.",0x1f);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar14 = (char)poVar9;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
        std::ostream::put(cVar14);
        std::ostream::flush();
        (soplex->spxout).m_verbosity = VVar4;
      }
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_3c0,
                   (soplex->_realLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
      bVar18 = ::soplex::
               SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::getRedCostRational(soplex,(VectorRational *)&local_3c0);
      if (bVar18) {
        VVar4 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar4) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"\nReduced costs (name, value):\n",0x1e);
          (soplex->spxout).m_verbosity = VVar4;
        }
        pNVar16 = local_2b8;
        if (0 < (soplex->_realLP->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          lVar24 = 0;
          lVar26 = 0;
          do {
            pnVar15 = local_3c0.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_2d0.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_388.ld,(longlong *)&local_2d0,(type *)0x0);
            iVar19 = boost::multiprecision::backends::
                     rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)((long)&(pnVar15->m_backend).m_value.num.m_backend.
                                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                          .m_data + lVar24),
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_388.ld);
            if ((cStack_353 == '\0') && (cStack_352 == '\0')) {
              operator_delete((void *)local_368._8_8_,(ulong)(uint)local_368._0_4_ << 3);
            }
            if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
              operator_delete(local_388.ld.data,(ulong)local_388.ld.capacity << 3);
            }
            if ((iVar19 != 0) && (VVar4 = (soplex->spxout).m_verbosity, 2 < (int)VVar4)) {
              local_3a8 = CONCAT44(local_3a8._4_4_,VVar4);
              (soplex->spxout).m_verbosity = INFO1;
              poVar9 = (soplex->spxout).m_streams[3];
              if (pNVar16->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
              }
              else {
                pcVar25 = pNVar16->mem +
                          (pNVar16->set).theitem[(pNVar16->set).thekey[lVar26].idx].data;
                sVar22 = strlen(pcVar25);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_2a8.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&((local_3c0.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_backend)
                                            .m_value.num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar24));
              boost::multiprecision::operator<<
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_2a8.ld);
              VVar4 = (Verbosity)local_3a8;
              poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar14 = (char)poVar9;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
              std::ostream::put(cVar14);
              std::ostream::flush();
              if ((local_273 == '\0') && (local_272 == '\0')) {
                operator_delete(local_280,(ulong)local_288 << 3);
              }
              if ((local_293 == '\0') && (local_292 == '\0')) {
                operator_delete(local_2a8.ld.data,(ulong)local_2a8.ld.capacity << 3);
              }
              (soplex->spxout).m_verbosity = VVar4;
            }
            lVar26 = lVar26 + 1;
            lVar24 = lVar24 + 0x40;
          } while (lVar26 < (soplex->_realLP->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        VVar4 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar4) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"All other reduced costs are zero.",0x21);
          poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          cVar14 = (char)poVar9;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
          std::ostream::put(cVar14);
          std::ostream::flush();
          (soplex->spxout).m_verbosity = VVar4;
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::~vector(&local_3c0);
    }
    else {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No dual (rational) solution available.\n",0x27);
        (soplex->spxout).m_verbosity = VVar4;
      }
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               *)local_328);
    return;
  }
  return;
}

Assistant:

static
void printDualSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                       bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> dual(soplex.numRows());

      if(soplex.getDualFarkas(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)
      }
      else if(soplex.isDualFeasible() && soplex.getDual(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)

         VectorBase<R> redcost(soplex.numCols());

         if(soplex.getRedCost(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(isNotZero(redcost[i], soplex.tolerances()->epsilon()))
               {
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                                << std::setw(printwidth) << std::setprecision(printprec)
                                << redcost[i] << std::endl;)
               }
            }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero (within "
                          << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                          << std::setprecision(8) << std::fixed << ")." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual information available.\n")
      }

   if(rational)
   {
      VectorRational dual(soplex.numRows());

      if(soplex.getDualFarkasRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(dual[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth)
                             << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isDualFeasible() && soplex.getDualRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRowsRational(); ++i)
         {
            if(dual[i] != (Rational) 0)
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t" << dual[i] << std::endl;)
            }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero." << std::endl;)

         VectorRational redcost(soplex.numCols());

         if(soplex.getRedCostRational(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(redcost[i] != (Rational) 0)
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << redcost[i] << std::endl;)
               }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual (rational) solution available.\n")
      }
}